

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::StyledStreamWriter(StyledStreamWriter *this,string *indentation)

{
  string *indentation_local;
  StyledStreamWriter *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->childValues_);
  this->document_ = (ostream *)0x0;
  std::__cxx11::string::string((string *)&this->indentString_);
  this->rightMargin_ = 0x4a;
  std::__cxx11::string::string((string *)&this->indentation_,(string *)indentation);
  this->addChildValues_ = false;
  return;
}

Assistant:

StyledStreamWriter::StyledStreamWriter( std::string indentation )
   : document_(NULL)
   , rightMargin_( 74 )
   , indentation_( indentation )
   , addChildValues_()
{
}